

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::ScriptContext::LoadScript
          (ScriptContext *this,byte *script,size_t cb,SRCINFO *pSrcInfo,CompileScriptException *pse,
          Utf8SourceInfo **ppSourceInfo,char16 *rootDisplayName,LoadScriptFlag loadScriptFlag,
          Var scriptSource)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  undefined1 local_b10 [6];
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  Parser parser;
  AutoDynamicCodeReference dynamicFunctionReference;
  AutoNestedHandledExceptionType local_50;
  undefined4 local_4c;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  Utf8SourceInfo **ppSourceInfo_local;
  CompileScriptException *pse_local;
  SRCINFO *pSrcInfo_local;
  size_t cb_local;
  byte *script_local;
  ScriptContext *this_local;
  
  ___autoNestedHandledExceptionType = ppSourceInfo;
  bVar2 = ThreadContext::IsScriptActive(this->threadContext);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xa21,"(!this->threadContext->IsScriptActive())",
                                "!this->threadContext->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pse == (CompileScriptException *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xa22,"(pse != nullptr)","pse != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_4c = 0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_50,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  AutoDynamicCodeReference::AutoDynamicCodeReference
            ((AutoDynamicCodeReference *)&parser.m_deferringAST,this);
  Parser::Parser((Parser *)local_b10,this,0,(PageAllocator *)0x0,false,0xaa8);
  pJVar4 = LoadScriptInternal(this,(Parser *)local_b10,script,cb,pSrcInfo,pse,
                              ___autoNestedHandledExceptionType,rootDisplayName,loadScriptFlag,
                              scriptSource);
  Parser::~Parser((Parser *)local_b10);
  AutoDynamicCodeReference::~AutoDynamicCodeReference
            ((AutoDynamicCodeReference *)&parser.m_deferringAST);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_50);
  return pJVar4;
}

Assistant:

JavascriptFunction* ScriptContext::LoadScript(const byte* script, size_t cb,
        SRCINFO const * pSrcInfo, CompileScriptException * pse, Utf8SourceInfo** ppSourceInfo,
        const char16 *rootDisplayName, LoadScriptFlag loadScriptFlag, Js::Var scriptSource)
    {
        Assert(!this->threadContext->IsScriptActive());
        Assert(pse != nullptr);
        HRESULT hr = NOERROR;
        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            Js::AutoDynamicCodeReference dynamicFunctionReference(this);
            Parser parser(this);
            return LoadScriptInternal(&parser, script, cb, pSrcInfo, pse, ppSourceInfo, rootDisplayName, loadScriptFlag, scriptSource);
        }
        catch (Js::OutOfMemoryException)
        {
            hr = E_OUTOFMEMORY;
        }
        catch (Js::StackOverflowException)
        {
            hr = VBSERR_OutOfStack;
        }
        pse->ProcessError(nullptr, hr, nullptr);
        return nullptr;
    }